

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

uchar * stbtt_GetGlyphSDF(stbtt_fontinfo *info,float scale,int glyph,int padding,uchar onedge_value,
                         float pixel_dist_scale,int *width,int *height,int *xoff,int *yoff)

{
  int iVar1;
  int iVar2;
  int iVar3;
  float fVar4;
  int iVar5;
  int iVar6;
  void *pvVar7;
  byte in_CL;
  int in_EDX;
  int *in_R8;
  int *in_R9;
  float in_XMM0_Da;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  double dVar26;
  float in_XMM1_Da;
  int *in_stack_00000008;
  int *in_stack_00000010;
  float d;
  float c_1;
  float b_1;
  float root;
  float discriminant;
  float c;
  float b;
  float a;
  float a_inv;
  float it;
  float t_1;
  float py_1;
  float px_1;
  float res [3];
  float my;
  float mx;
  float by_1;
  float bx_1;
  float ay;
  float ax;
  int num;
  float box_y1;
  float box_x1;
  float box_y0;
  float box_x0;
  float y1_3;
  float x1_3;
  float y2_1;
  float x2_1;
  float t;
  float py;
  float px;
  float dy;
  float dx;
  float dist_1;
  float y1_2;
  float x1_2;
  float dist2;
  float y0_2;
  float x0_2;
  int winding;
  float y_gspace;
  float x_gspace;
  float sy;
  float sx;
  float min_dist;
  float val;
  float len2;
  float by;
  float bx;
  float y0_1;
  float x0_1;
  float y1_1;
  float x1_1;
  float y2;
  float x2;
  float dist;
  float y1;
  float x1;
  float y0;
  float x0;
  int num_verts;
  stbtt_vertex *verts;
  float *precompute;
  int j;
  int i;
  int y;
  int x;
  uchar *data;
  int h;
  int w;
  int iy1;
  int ix1;
  int iy0;
  int ix0;
  float scale_y;
  float scale_x;
  undefined4 in_stack_fffffffffffffe48;
  float in_stack_fffffffffffffe4c;
  float in_stack_fffffffffffffe50;
  float in_stack_fffffffffffffe54;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  undefined4 in_stack_fffffffffffffe70;
  float in_stack_fffffffffffffe74;
  float in_stack_fffffffffffffe7c;
  float in_stack_fffffffffffffe80;
  float in_stack_fffffffffffffe84;
  float in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe8c;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  float local_14c;
  float local_148;
  float local_144;
  int local_128;
  float in_stack_ffffffffffffff40;
  float in_stack_ffffffffffffff44;
  long local_80;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  uchar *local_8;
  
  if ((in_XMM0_Da != 0.0) || (NAN(in_XMM0_Da))) {
    stbtt_GetGlyphBitmapBoxSubpixel
              ((stbtt_fontinfo *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
               in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88,in_stack_fffffffffffffe84,
               in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,
               (int *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
               (int *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
               (int *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
               (int *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    if ((local_44 == local_4c) || (local_48 == local_50)) {
      local_8 = (uchar *)0x0;
    }
    else {
      iVar1 = local_44 - in_EDX;
      iVar2 = local_48 - in_EDX;
      iVar3 = (in_EDX + local_4c) - iVar1;
      if (in_R8 != (int *)0x0) {
        *in_R8 = iVar3;
      }
      if (in_R9 != (int *)0x0) {
        *in_R9 = (in_EDX + local_50) - iVar2;
      }
      if (in_stack_00000008 != (int *)0x0) {
        *in_stack_00000008 = iVar1;
      }
      if (in_stack_00000010 != (int *)0x0) {
        *in_stack_00000010 = iVar2;
      }
      fVar4 = -in_XMM0_Da;
      iVar5 = stbtt_GetGlyphShape((stbtt_fontinfo *)
                                  CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                                  (int)in_stack_fffffffffffffe54,
                                  (stbtt_vertex **)
                                  CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      local_8 = (uchar *)nk_stbtt_malloc(CONCAT44(in_stack_fffffffffffffe54,
                                                  in_stack_fffffffffffffe50),
                                         (void *)CONCAT44(in_stack_fffffffffffffe4c,
                                                          in_stack_fffffffffffffe48));
      pvVar7 = nk_stbtt_malloc(CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                               (void *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48)
                              );
      local_70 = iVar5 + -1;
      for (local_6c = 0; local_68 = iVar2, local_6c < iVar5; local_6c = local_6c + 1) {
        if (*(char *)(local_80 + (long)local_6c * 0xe + 0xc) == '\x02') {
          fVar8 = (float)(int)*(short *)(local_80 + (long)local_6c * 0xe) * in_XMM0_Da;
          fVar9 = (float)(int)*(short *)(local_80 + (long)local_6c * 0xe + 2) * fVar4;
          fVar10 = (float)(int)*(short *)(local_80 + (long)local_70 * 0xe) * in_XMM0_Da;
          fVar11 = (float)(int)*(short *)(local_80 + (long)local_70 * 0xe + 2) * fVar4;
          dVar26 = sqrt((double)((fVar10 - fVar8) * (fVar10 - fVar8) +
                                (fVar11 - fVar9) * (fVar11 - fVar9)));
          fVar8 = (float)dVar26;
          if ((fVar8 != 0.0) || (NAN(fVar8))) {
            in_stack_fffffffffffffe7c = 1.0 / fVar8;
          }
          else {
            in_stack_fffffffffffffe7c = 0.0;
          }
          *(float *)((long)pvVar7 + (long)local_6c * 4) = in_stack_fffffffffffffe7c;
        }
        else if (*(char *)(local_80 + (long)local_6c * 0xe + 0xc) == '\x03') {
          fVar8 = (float)(int)*(short *)(local_80 + (long)local_6c * 0xe + 4) * in_XMM0_Da;
          fVar9 = (float)(int)*(short *)(local_80 + (long)local_6c * 0xe + 6) * fVar4;
          fVar8 = ((float)(int)*(short *)(local_80 + (long)local_6c * 0xe) * in_XMM0_Da -
                  (fVar8 + fVar8)) +
                  (float)(int)*(short *)(local_80 + (long)local_70 * 0xe) * in_XMM0_Da;
          fVar9 = ((float)(int)*(short *)(local_80 + (long)local_6c * 0xe + 2) * fVar4 -
                  (fVar9 + fVar9)) +
                  (float)(int)*(short *)(local_80 + (long)local_70 * 0xe + 2) * fVar4;
          in_stack_ffffffffffffff44 = fVar8 * fVar8 + fVar9 * fVar9;
          if ((in_stack_ffffffffffffff44 != 0.0) || (NAN(in_stack_ffffffffffffff44))) {
            *(float *)((long)pvVar7 + (long)local_6c * 4) = 1.0 / (fVar8 * fVar8 + fVar9 * fVar9);
          }
          else {
            *(undefined4 *)((long)pvVar7 + (long)local_6c * 4) = 0;
          }
        }
        else {
          *(undefined4 *)((long)pvVar7 + (long)local_6c * 4) = 0;
        }
        local_70 = local_6c;
      }
      for (; local_64 = iVar1, local_68 < in_EDX + local_50; local_68 = local_68 + 1) {
        for (; local_64 < in_EDX + local_4c; local_64 = local_64 + 1) {
          fVar8 = 999999.0;
          fVar9 = (float)local_64 + 0.5;
          fVar10 = (float)local_68 + 0.5;
          iVar6 = stbtt__compute_crossings_x
                            (in_stack_ffffffffffffff44,in_stack_ffffffffffffff40,0x497423f0,
                             (stbtt_vertex *)CONCAT44(fVar10,fVar9 / in_XMM0_Da));
          for (local_6c = 0; local_6c < iVar5; local_6c = local_6c + 1) {
            fVar11 = (float)(int)*(short *)(local_80 + (long)local_6c * 0xe) * in_XMM0_Da;
            fVar12 = (float)(int)*(short *)(local_80 + (long)local_6c * 0xe + 2) * fVar4;
            fVar13 = (fVar11 - fVar9) * (fVar11 - fVar9) + (fVar12 - fVar10) * (fVar12 - fVar10);
            if (fVar13 < fVar8 * fVar8) {
              dVar26 = sqrt((double)fVar13);
              fVar8 = (float)dVar26;
            }
            if (*(char *)(local_80 + (long)local_6c * 0xe + 0xc) == '\x02') {
              fVar14 = (float)(int)*(short *)(local_80 + (long)(local_6c + -1) * 0xe) * in_XMM0_Da;
              fVar15 = (float)(int)*(short *)(local_80 + (long)(local_6c + -1) * 0xe + 2) * fVar4;
              fVar13 = ABS((fVar14 - fVar11) * (fVar12 - fVar10) +
                           -((fVar15 - fVar12) * (fVar11 - fVar9))) *
                       *(float *)((long)pvVar7 + (long)local_6c * 4);
              if (fVar13 < fVar8) {
                fVar14 = fVar14 - fVar11;
                fVar15 = fVar15 - fVar12;
                fVar11 = -((fVar11 - fVar9) * fVar14 + (fVar12 - fVar10) * fVar15) /
                         (fVar14 * fVar14 + fVar15 * fVar15);
                if ((0.0 <= fVar11) && (fVar11 <= 1.0)) {
                  fVar8 = fVar13;
                }
              }
            }
            else if (*(char *)(local_80 + (long)local_6c * 0xe + 0xc) == '\x03') {
              fVar14 = (float)(int)*(short *)(local_80 + (long)(local_6c + -1) * 0xe) * in_XMM0_Da;
              fVar15 = (float)(int)*(short *)(local_80 + (long)(local_6c + -1) * 0xe + 2) * fVar4;
              fVar16 = (float)(int)*(short *)(local_80 + (long)local_6c * 0xe + 4) * in_XMM0_Da;
              fVar17 = (float)(int)*(short *)(local_80 + (long)local_6c * 0xe + 6) * fVar4;
              fVar13 = fVar16;
              if (fVar11 < fVar16) {
                fVar13 = fVar11;
              }
              fVar24 = fVar14;
              if ((fVar13 < fVar14) &&
                 (fVar24 = fVar16, in_stack_fffffffffffffe74 = fVar16, fVar11 < fVar16)) {
                fVar24 = fVar11;
                in_stack_fffffffffffffe74 = fVar11;
              }
              fVar25 = fVar17;
              if (fVar12 < fVar17) {
                fVar25 = fVar12;
              }
              fVar18 = fVar15;
              if ((fVar25 < fVar15) && (fVar18 = fVar17, fVar12 < fVar17)) {
                fVar18 = fVar12;
              }
              fVar25 = fVar11;
              if (fVar11 < fVar16) {
                fVar25 = fVar16;
              }
              fVar19 = fVar14;
              if ((fVar14 <= fVar25) && (fVar19 = fVar11, fVar11 < fVar16)) {
                fVar19 = fVar16;
              }
              in_stack_fffffffffffffe54 = fVar12;
              if (fVar12 < fVar17) {
                in_stack_fffffffffffffe54 = fVar17;
              }
              in_stack_fffffffffffffe50 = fVar15;
              if ((fVar15 <= in_stack_fffffffffffffe54) &&
                 (in_stack_fffffffffffffe4c = fVar12, in_stack_fffffffffffffe50 = fVar12,
                 fVar12 < fVar17)) {
                in_stack_fffffffffffffe4c = fVar17;
                in_stack_fffffffffffffe50 = fVar17;
              }
              if ((((fVar24 - fVar8 < fVar9) && (fVar9 < fVar19 + fVar8)) &&
                  (fVar18 - fVar8 < fVar10)) && (fVar10 < in_stack_fffffffffffffe50 + fVar8)) {
                local_128 = 0;
                fVar18 = fVar16 - fVar11;
                fVar19 = fVar17 - fVar12;
                fVar20 = (fVar11 - (fVar16 + fVar16)) + fVar14;
                fVar21 = (fVar12 - (fVar17 + fVar17)) + fVar15;
                fVar22 = fVar11 - fVar9;
                fVar23 = fVar12 - fVar10;
                fVar25 = *(float *)((long)pvVar7 + (long)local_6c * 4);
                if ((fVar25 != 0.0) || (NAN(fVar25))) {
                  local_128 = stbtt__solve_cubic((fVar22 * fVar18 + fVar23 * fVar19) * fVar25,
                                                 in_stack_fffffffffffffe7c,fVar13,
                                                 (float *)CONCAT44(in_stack_fffffffffffffe74,fVar24)
                                                );
                }
                else {
                  fVar13 = (fVar18 * fVar20 + fVar19 * fVar21) * 3.0;
                  fVar24 = fVar18 * fVar18 + fVar19 * fVar19;
                  fVar24 = fVar24 + fVar24 + fVar22 * fVar20 + fVar23 * fVar21;
                  fVar25 = fVar22 * fVar18 + fVar23 * fVar19;
                  if ((fVar13 != 0.0) || (NAN(fVar13))) {
                    fVar25 = fVar24 * fVar24 + -(fVar13 * 4.0 * fVar25);
                    if (0.0 <= fVar25) {
                      dVar26 = sqrt((double)fVar25);
                      local_14c = (-fVar24 - (float)dVar26) / (fVar13 * 2.0);
                      local_148 = (-fVar24 + (float)dVar26) / (fVar13 * 2.0);
                      local_128 = 2;
                    }
                    else {
                      local_128 = 0;
                    }
                  }
                  else if ((fVar24 != 0.0) || (NAN(fVar24))) {
                    local_14c = -fVar25 / fVar24;
                    local_128 = 1;
                  }
                }
                if (((0 < local_128) && (0.0 <= local_14c)) && (local_14c <= 1.0)) {
                  fVar13 = 1.0 - local_14c;
                  fVar24 = local_14c * local_14c * fVar14 +
                           fVar13 * fVar13 * fVar11 + local_14c * 2.0 * fVar13 * fVar16;
                  fVar13 = local_14c * local_14c * fVar15 +
                           fVar13 * fVar13 * fVar12 + local_14c * 2.0 * fVar13 * fVar17;
                  fVar13 = (fVar24 - fVar9) * (fVar24 - fVar9) +
                           (fVar13 - fVar10) * (fVar13 - fVar10);
                  if (fVar13 < fVar8 * fVar8) {
                    dVar26 = sqrt((double)fVar13);
                    fVar8 = (float)dVar26;
                  }
                }
                if (((1 < local_128) && (0.0 <= local_148)) && (local_148 <= 1.0)) {
                  fVar13 = 1.0 - local_148;
                  fVar24 = local_148 * local_148 * fVar14 +
                           fVar13 * fVar13 * fVar11 + local_148 * 2.0 * fVar13 * fVar16;
                  fVar13 = local_148 * local_148 * fVar15 +
                           fVar13 * fVar13 * fVar12 + local_148 * 2.0 * fVar13 * fVar17;
                  fVar13 = (fVar24 - fVar9) * (fVar24 - fVar9) +
                           (fVar13 - fVar10) * (fVar13 - fVar10);
                  if (fVar13 < fVar8 * fVar8) {
                    dVar26 = sqrt((double)fVar13);
                    fVar8 = (float)dVar26;
                  }
                }
                if (((2 < local_128) && (0.0 <= local_144)) && (local_144 <= 1.0)) {
                  fVar13 = 1.0 - local_144;
                  fVar11 = local_144 * local_144 * fVar14 +
                           fVar13 * fVar13 * fVar11 + local_144 * 2.0 * fVar13 * fVar16;
                  fVar12 = local_144 * local_144 * fVar15 +
                           fVar13 * fVar13 * fVar12 + local_144 * 2.0 * fVar13 * fVar17;
                  fVar11 = (fVar11 - fVar9) * (fVar11 - fVar9) +
                           (fVar12 - fVar10) * (fVar12 - fVar10);
                  if (fVar11 < fVar8 * fVar8) {
                    dVar26 = sqrt((double)fVar11);
                    fVar8 = (float)dVar26;
                  }
                }
              }
            }
          }
          if (iVar6 == 0) {
            fVar8 = -fVar8;
          }
          in_stack_ffffffffffffff40 = in_XMM1_Da * fVar8 + (float)in_CL;
          if (0.0 <= in_stack_ffffffffffffff40) {
            if (255.0 < in_stack_ffffffffffffff40) {
              in_stack_ffffffffffffff40 = 255.0;
            }
          }
          else {
            in_stack_ffffffffffffff40 = 0.0;
          }
          local_8[(local_68 - iVar2) * iVar3 + (local_64 - iVar1)] =
               (uchar)(int)in_stack_ffffffffffffff40;
        }
      }
      nk_stbtt_free((void *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                    (void *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      nk_stbtt_free((void *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                    (void *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    }
  }
  else {
    local_8 = (uchar *)0x0;
  }
  return local_8;
}

Assistant:

STBTT_DEF unsigned char * stbtt_GetGlyphSDF(const stbtt_fontinfo *info, float scale, int glyph, int padding, unsigned char onedge_value, float pixel_dist_scale, int *width, int *height, int *xoff, int *yoff)
{
float scale_x = scale, scale_y = scale;
int ix0,iy0,ix1,iy1;
int w,h;
unsigned char *data;

if (scale == 0) return NULL;

stbtt_GetGlyphBitmapBoxSubpixel(info, glyph, scale, scale, 0.0f,0.0f, &ix0,&iy0,&ix1,&iy1);

/*  if empty, return NULL */
if (ix0 == ix1 || iy0 == iy1)
return NULL;

ix0 -= padding;
iy0 -= padding;
ix1 += padding;
iy1 += padding;

w = (ix1 - ix0);
h = (iy1 - iy0);

if (width ) *width  = w;
if (height) *height = h;
if (xoff  ) *xoff   = ix0;
if (yoff  ) *yoff   = iy0;

/*  invert for y-downwards bitmaps */
scale_y = -scale_y;

{
int x,y,i,j;
float *precompute;
stbtt_vertex *verts;
int num_verts = stbtt_GetGlyphShape(info, glyph, &verts);
data = (unsigned char *) STBTT_malloc(w * h, info->userdata);
precompute = (float *) STBTT_malloc(num_verts * sizeof(float), info->userdata);

for (i=0,j=num_verts-1; i < num_verts; j=i++) {
if (verts[i].type == STBTT_vline) {
float x0 = verts[i].x*scale_x, y0 = verts[i].y*scale_y;
float x1 = verts[j].x*scale_x, y1 = verts[j].y*scale_y;
float dist = (float) STBTT_sqrt((x1-x0)*(x1-x0) + (y1-y0)*(y1-y0));
precompute[i] = (dist == 0) ? 0.0f : 1.0f / dist;
} else if (verts[i].type == STBTT_vcurve) {
float x2 = verts[j].x *scale_x, y2 = verts[j].y *scale_y;
float x1 = verts[i].cx*scale_x, y1 = verts[i].cy*scale_y;
float x0 = verts[i].x *scale_x, y0 = verts[i].y *scale_y;
float bx = x0 - 2*x1 + x2, by = y0 - 2*y1 + y2;
float len2 = bx*bx + by*by;
if (len2 != 0.0f)
precompute[i] = 1.0f / (bx*bx + by*by);
else
precompute[i] = 0.0f;
} else
precompute[i] = 0.0f;
}

for (y=iy0; y < iy1; ++y) {
for (x=ix0; x < ix1; ++x) {
float val;
float min_dist = 999999.0f;
float sx = (float) x + 0.5f;
float sy = (float) y + 0.5f;
float x_gspace = (sx / scale_x);
float y_gspace = (sy / scale_y);

int winding = stbtt__compute_crossings_x(x_gspace, y_gspace, num_verts, verts); /*  @OPTIMIZE: this could just be a rasterization, but needs to be line vs. non-tesselated curves so a new path */

for (i=0; i < num_verts; ++i) {
float x0 = verts[i].x*scale_x, y0 = verts[i].y*scale_y;

/*  check against every point here rather than inside line/curve primitives -- @TODO: wrong if multiple 'moves' in a row produce a garbage point, and given culling, probably more efficient to do within line/curve */
float dist2 = (x0-sx)*(x0-sx) + (y0-sy)*(y0-sy);
if (dist2 < min_dist*min_dist)
min_dist = (float) STBTT_sqrt(dist2);

if (verts[i].type == STBTT_vline) {
float x1 = verts[i-1].x*scale_x, y1 = verts[i-1].y*scale_y;

/*  coarse culling against bbox */
/* if (sx > STBTT_min(x0,x1)-min_dist && sx < STBTT_max(x0,x1)+min_dist && */
/*     sy > STBTT_min(y0,y1)-min_dist && sy < STBTT_max(y0,y1)+min_dist) */
float dist = (float) STBTT_fabs((x1-x0)*(y0-sy) - (y1-y0)*(x0-sx)) * precompute[i];
STBTT_assert(i != 0);
if (dist < min_dist) {
/*  check position along line */
/*  x' = x0 + t*(x1-x0), y' = y0 + t*(y1-y0) */
/*  minimize (x'-sx)*(x'-sx)+(y'-sy)*(y'-sy) */
float dx = x1-x0, dy = y1-y0;
float px = x0-sx, py = y0-sy;
/*  minimize (px+t*dx)^2 + (py+t*dy)^2 = px*px + 2*px*dx*t + t^2*dx*dx + py*py + 2*py*dy*t + t^2*dy*dy */
/*  derivative: 2*px*dx + 2*py*dy + (2*dx*dx+2*dy*dy)*t, set to 0 and solve */
float t = -(px*dx + py*dy) / (dx*dx + dy*dy);
if (t >= 0.0f && t <= 1.0f)
min_dist = dist;
}
} else if (verts[i].type == STBTT_vcurve) {
float x2 = verts[i-1].x *scale_x, y2 = verts[i-1].y *scale_y;
float x1 = verts[i  ].cx*scale_x, y1 = verts[i  ].cy*scale_y;
float box_x0 = STBTT_min(STBTT_min(x0,x1),x2);
float box_y0 = STBTT_min(STBTT_min(y0,y1),y2);
float box_x1 = STBTT_max(STBTT_max(x0,x1),x2);
float box_y1 = STBTT_max(STBTT_max(y0,y1),y2);
/*  coarse culling against bbox to avoid computing cubic unnecessarily */
if (sx > box_x0-min_dist && sx < box_x1+min_dist && sy > box_y0-min_dist && sy < box_y1+min_dist) {
int num=0;
float ax = x1-x0, ay = y1-y0;
float bx = x0 - 2*x1 + x2, by = y0 - 2*y1 + y2;
float mx = x0 - sx, my = y0 - sy;
float res[3],px,py,t,it;
float a_inv = precompute[i];
if (a_inv == 0.0) { /*  if a_inv is 0, it's 2nd degree so use quadratic formula */
float a = 3*(ax*bx + ay*by);
float b = 2*(ax*ax + ay*ay) + (mx*bx+my*by);
float c = mx*ax+my*ay;
if (a == 0.0) { /*  if a is 0, it's linear */
if (b != 0.0) {
res[num++] = -c/b;
}
} else {
float discriminant = b*b - 4*a*c;
if (discriminant < 0)
num = 0;
else {
float root = (float) STBTT_sqrt(discriminant);
res[0] = (-b - root)/(2*a);
res[1] = (-b + root)/(2*a);
num = 2; /*  don't bother distinguishing 1-solution case, as code below will still work */
}
}
} else {
float b = 3*(ax*bx + ay*by) * a_inv; /*  could precompute this as it doesn't depend on sample point */
float c = (2*(ax*ax + ay*ay) + (mx*bx+my*by)) * a_inv;
float d = (mx*ax+my*ay) * a_inv;
num = stbtt__solve_cubic(b, c, d, res);
}
if (num >= 1 && res[0] >= 0.0f && res[0] <= 1.0f) {
t = res[0], it = 1.0f - t;
px = it*it*x0 + 2*t*it*x1 + t*t*x2;
py = it*it*y0 + 2*t*it*y1 + t*t*y2;
dist2 = (px-sx)*(px-sx) + (py-sy)*(py-sy);
if (dist2 < min_dist * min_dist)
min_dist = (float) STBTT_sqrt(dist2);
}
if (num >= 2 && res[1] >= 0.0f && res[1] <= 1.0f) {
t = res[1], it = 1.0f - t;
px = it*it*x0 + 2*t*it*x1 + t*t*x2;
py = it*it*y0 + 2*t*it*y1 + t*t*y2;
dist2 = (px-sx)*(px-sx) + (py-sy)*(py-sy);
if (dist2 < min_dist * min_dist)
min_dist = (float) STBTT_sqrt(dist2);
}
if (num >= 3 && res[2] >= 0.0f && res[2] <= 1.0f) {
t = res[2], it = 1.0f - t;
px = it*it*x0 + 2*t*it*x1 + t*t*x2;
py = it*it*y0 + 2*t*it*y1 + t*t*y2;
dist2 = (px-sx)*(px-sx) + (py-sy)*(py-sy);
if (dist2 < min_dist * min_dist)
min_dist = (float) STBTT_sqrt(dist2);
}
}
}
}
if (winding == 0)
min_dist = -min_dist;  /*  if outside the shape, value is negative */
val = onedge_value + pixel_dist_scale * min_dist;
if (val < 0)
val = 0;
else if (val > 255)
val = 255;
data[(y-iy0)*w+(x-ix0)] = (unsigned char) val;
}
}
STBTT_free(precompute, info->userdata);
STBTT_free(verts, info->userdata);
}
return data;
}